

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O3

string * loguru::prettify_stacktrace(string *__return_storage_ptr__,string *input)

{
  pointer pcVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  regex template_spaces_re;
  regex std_allocator_re;
  char *local_b0;
  size_t local_a8;
  char local_a0;
  undefined7 uStack_9f;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_90;
  long *local_70;
  size_t local_68;
  long local_60 [2];
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (input->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + input->_M_string_length);
  do_replacements((StringPairList *)s_user_stack_cleanups_abi_cxx11_,__return_storage_ptr__);
  do_replacements((StringPairList *)REPLACE_LIST_abi_cxx11_,__return_storage_ptr__);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_50,",\\s*std::allocator<[^<>]+>",0x10);
  local_b0 = &local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  local_90._M_loc = (locale_type)0x0;
  local_90._9_7_ = 0;
  local_90._M_automaton.
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  _Var2._M_current = (__return_storage_ptr__->_M_dataplus)._M_p;
  local_90._0_8_ = &local_90._M_automaton;
  std::
  __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90,_Var2,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(_Var2._M_current + __return_storage_ptr__->_M_string_length),&local_50,local_b0,
             local_a8,0);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_90);
  if ((_AutomatonPtr *)local_90._0_8_ != &local_90._M_automaton) {
    operator_delete((void *)local_90._0_8_,
                    CONCAT71(local_90._M_automaton.
                             super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr._1_7_,
                             local_90._M_automaton.
                             super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr._0_1_) + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_90,"<\\s*([^<> ]+)\\s*>",0x10);
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"<$1>","");
  local_a8 = 0;
  local_a0 = '\0';
  _Var2._M_current = (__return_storage_ptr__->_M_dataplus)._M_p;
  local_b0 = &local_a0;
  std::
  __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0,_Var2,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(_Var2._M_current + __return_storage_ptr__->_M_string_length),&local_90,
             (char *)local_70,local_68,0);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_90);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string prettify_stacktrace(const std::string& input)
	{
		std::string output = input;

		do_replacements(s_user_stack_cleanups, output);
		do_replacements(REPLACE_LIST, output);

		try {
			std::regex std_allocator_re(R"(,\s*std::allocator<[^<>]+>)");
			output = std::regex_replace(output, std_allocator_re, std::string(""));

			std::regex template_spaces_re(R"(<\s*([^<> ]+)\s*>)");
			output = std::regex_replace(output, template_spaces_re, std::string("<$1>"));
		} catch (std::regex_error&) {
			// Probably old GCC.
		}

		return output;
	}